

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

void luaH_resize(lua_State *L,Table *t,int nasize,int nhsize)

{
  byte bVar1;
  Node *block;
  Node *pNVar2;
  TValue *pTVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  
  iVar10 = t->sizearray;
  lVar9 = (long)iVar10;
  bVar1 = t->lsizenode;
  block = t->node;
  if (iVar10 < nasize) {
    if (nasize < -1) goto LAB_0010f389;
    pTVar3 = (TValue *)luaM_realloc_(L,t->array,lVar9 << 4,(long)nasize << 4);
    t->array = pTVar3;
    lVar5 = (long)t->sizearray;
    piVar4 = &pTVar3[lVar5].tt_;
    for (; lVar5 < nasize; lVar5 = lVar5 + 1) {
      *piVar4 = 0;
      piVar4 = piVar4 + 4;
    }
    t->sizearray = nasize;
  }
  setnodevector(L,t,nhsize);
  if (nasize < iVar10) {
    lVar6 = (long)nasize;
    t->sizearray = nasize;
    lVar8 = lVar6 << 4;
    iVar10 = nasize;
    for (lVar5 = lVar6; iVar10 = iVar10 + 1, lVar5 < lVar9; lVar5 = lVar5 + 1) {
      if (*(int *)((long)&t->array->tt_ + lVar8) != 0) {
        luaH_setint(L,t,iVar10,(TValue *)((long)&t->array->value_ + lVar8));
      }
      lVar8 = lVar8 + 0x10;
    }
    if (nasize < -1) {
LAB_0010f389:
      luaM_toobig(L);
    }
    pTVar3 = (TValue *)luaM_realloc_(L,t->array,lVar9 << 4,lVar6 << 4);
    t->array = pTVar3;
  }
  uVar11 = 1L << (bVar1 & 0x3f);
  uVar7 = uVar11 & 0xffffffff;
  pNVar2 = block + uVar11;
  while( true ) {
    if ((int)uVar7 < 1) break;
    if (pNVar2[-1].i_val.tt_ != 0) {
      pTVar3 = luaH_set(L,t,&pNVar2[-1].i_key.tvk);
      pTVar3->value_ = pNVar2[-1].i_val.value_;
      pTVar3->tt_ = pNVar2[-1].i_val.tt_;
    }
    uVar7 = (ulong)((int)uVar7 - 1);
    pNVar2 = pNVar2 + -1;
  }
  if (block != &dummynode_) {
    luaM_realloc_(L,block,(long)(int)uVar11 * 0x28,0);
    return;
  }
  return;
}

Assistant:

void luaH_resize (lua_State *L, Table *t, int nasize, int nhsize) {
  int i;
  int oldasize = t->sizearray;
  int oldhsize = t->lsizenode;
  Node *nold = t->node;  /* save old hash ... */
  if (nasize > oldasize)  /* array part must grow? */
    setarrayvector(L, t, nasize);
  /* create new hash part with appropriate size */
  setnodevector(L, t, nhsize);
  if (nasize < oldasize) {  /* array part must shrink? */
    t->sizearray = nasize;
    /* re-insert elements from vanishing slice */
    for (i=nasize; i<oldasize; i++) {
      if (!ttisnil(&t->array[i]))
        luaH_setint(L, t, i + 1, &t->array[i]);
    }
    /* shrink array */
    luaM_reallocvector(L, t->array, oldasize, nasize, TValue);
  }
  /* re-insert elements from hash part */
  for (i = twoto(oldhsize) - 1; i >= 0; i--) {
    Node *old = nold+i;
    if (!ttisnil(gval(old))) {
      /* doesn't need barrier/invalidate cache, as entry was
         already present in the table */
      setobjt2t(L, luaH_set(L, t, gkey(old)), gval(old));
    }
  }
  if (!isdummy(nold))
    luaM_freearray(L, nold, cast(size_t, twoto(oldhsize))); /* free old array */
}